

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_manager.c
# Opt level: O0

int plugin_manager_clear(plugin_manager manager,plugin p)

{
  long in_RSI;
  plugin in_RDI;
  int result;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RSI == 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = plugin_manager_unregister
                      ((plugin_manager)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                       ,in_RDI);
    plugin_destroy((plugin)0x12161d);
  }
  return iVar1;
}

Assistant:

int plugin_manager_clear(plugin_manager manager, plugin p)
{
	if (p == NULL)
	{
		return 1;
	}

	/* Remove the plugin from the plugins set */
	int result = plugin_manager_unregister(manager, p);

	/* Unload the dynamic link library and destroy the plugin */
	plugin_destroy(p);

	return result;
}